

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inverters.cpp
# Opt level: O1

bool Kernel::Rebalancing::Inverters::nonZero<Kernel::NumTraits<Kernel::RealConstantType>>
               (TermList *t)

{
  bool bVar1;
  bool bVar2;
  Symbol *pSVar3;
  Symbol *pSVar4;
  bool bVar5;
  int local_70 [2];
  RealConstantType local_68;
  RealConstantType local_48;
  
  if ((t->_content & 3) == 0) {
    pSVar3 = *(Symbol **)(*(long *)(DAT_00b7e1b0 + 0x60) + (ulong)*(uint *)(t->_content + 8) * 8);
    bVar5 = Signature::Symbol::numeralConstant(pSVar3,(RealConstantType *)0x0);
    pSVar3 = pSVar3 + 1;
    if (!bVar5) {
      pSVar3 = (Symbol *)0x0;
    }
  }
  else {
    pSVar3 = (Symbol *)0x0;
  }
  if ((t->_content & 3) == 0) {
    pSVar4 = *(Symbol **)(*(long *)(DAT_00b7e1b0 + 0x60) + (ulong)*(uint *)(t->_content + 8) * 8);
    bVar5 = Signature::Symbol::numeralConstant(pSVar4,(RealConstantType *)0x0);
    pSVar4 = pSVar4 + 1;
    if (!bVar5) {
      pSVar4 = (Symbol *)0x0;
    }
  }
  else {
    pSVar4 = (Symbol *)0x0;
  }
  bVar5 = pSVar3 != (Symbol *)0x0;
  if (bVar5) {
    RealConstantType::RealConstantType(&local_48,(RealConstantType *)pSVar3);
    local_70[1] = 0;
    bVar1 = operator!=(&local_48,local_70 + 1);
    if (bVar1) {
      bVar5 = true;
      bVar1 = false;
      bVar2 = true;
      goto LAB_005bee7a;
    }
  }
  if (pSVar4 == (Symbol *)0x0) {
    bVar1 = false;
    bVar2 = false;
  }
  else {
    RealConstantType::RealConstantType(&local_68,(RealConstantType *)pSVar4);
    local_70[0] = 0;
    bVar2 = operator!=(&local_68,local_70);
    bVar1 = true;
  }
LAB_005bee7a:
  if (bVar1) {
    mpz_clear(local_68.super_RationalConstantType._den._val);
    mpz_clear((__mpz_struct *)&local_68);
  }
  if (bVar5) {
    mpz_clear(local_48.super_RationalConstantType._den._val);
    mpz_clear((__mpz_struct *)&local_48);
  }
  return bVar2;
}

Assistant:

bool nonZero(const TermList &t) {
  NumTraits n{};
  auto n1 = n.tryNumeral(t);
  auto n2 = asig(n).tryNumeral(t);
  return ( n1.isSome() && *n1 != 0 ) 
      || ( n2.isSome() && *n2 != 0 );
}